

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CEseqFloatVisitor::processRightEseqInCJump
          (CEseqFloatVisitor *this,CJumpConditionalStatement *cjump,CExpression *left,
          CEseqExpression *rightEseq)

{
  bool bVar1;
  TLogicOperator TVar2;
  CStatement *pCVar3;
  CSeqStatement *pCVar4;
  CMoveStatement *this_00;
  CTempExpression *pCVar5;
  CSeqStatement *this_01;
  CJumpConditionalStatement *pCVar6;
  CMemExpression *this_02;
  CExpression *pCVar7;
  CEseqExpression *in_R8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_178;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_170;
  undefined1 local_161;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_160;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_158;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_150;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_148;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_140;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_138;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_130;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_128;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_120;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_118;
  undefined1 local_109;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_108;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_100;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_e0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d8;
  undefined1 local_d0 [8];
  CTemp temp;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_68;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_60 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_48;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_40;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_38;
  CEseqExpression *local_30;
  CEseqExpression *rightEseq_local;
  CExpression *left_local;
  CJumpConditionalStatement *cjump_local;
  CEseqFloatVisitor *this_local;
  
  local_30 = in_R8;
  rightEseq_local = rightEseq;
  left_local = left;
  cjump_local = cjump;
  this_local = this;
  pCVar3 = CEseqExpression::getStatement(in_R8);
  bVar1 = isExpCommuteWithStm(&rightEseq->super_CExpression,pCVar3);
  if (bVar1) {
    pCVar4 = (CSeqStatement *)operator_new(0x18);
    temp._30_1_ = 1;
    pCVar3 = CEseqExpression::getStatement(local_30);
    (*(pCVar3->super_IStatement).super_INode._vptr_INode[3])(&local_48);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_40,&local_48);
    pCVar6 = (CJumpConditionalStatement *)operator_new(0x30);
    temp._31_1_ = 1;
    TVar2 = CJumpConditionalStatement::Operation((CJumpConditionalStatement *)left_local);
    (*(rightEseq_local->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70,&local_78);
    pCVar7 = CEseqExpression::getExpression(local_30);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_80,&local_88);
    CJumpConditionalStatement::TrueLabel((CJumpConditionalStatement *)left_local);
    CLabelStatement::CastCopy((CLabelStatement *)local_98);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_98 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_98);
    CJumpConditionalStatement::FalseLabel((CJumpConditionalStatement *)left_local);
    CLabelStatement::CastCopy((CLabelStatement *)local_a8);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_a8 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_a8);
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar6,TVar2,&local_70,&local_80,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_98 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_a8 + 8));
    temp._31_1_ = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_68,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (local_60,&local_68);
    CSeqStatement::CSeqStatement(pCVar4,&local_40,local_60);
    temp._30_1_ = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_38,(pointer)pCVar4);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               this,&local_38);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_38);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (local_60);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_68);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_a8 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_a8);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_98 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_98);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_48);
  }
  else {
    CTemp::CTemp((CTemp *)local_d0);
    pCVar4 = (CSeqStatement *)operator_new(0x18);
    this_00 = (CMoveStatement *)operator_new(0x18);
    local_109 = 1;
    pCVar5 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar5,(CTemp *)local_d0);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_f8,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_f0,&local_f8);
    (*(rightEseq_local->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_108)
    ;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_100,&local_108);
    CMoveStatement::CMoveStatement(this_00,&local_f0,&local_100);
    local_109 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_e8,(pointer)this_00);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_e0,&local_e8);
    this_01 = (CSeqStatement *)operator_new(0x18);
    pCVar3 = CEseqExpression::getStatement(local_30);
    (*(pCVar3->super_IStatement).super_INode._vptr_INode[3])(&local_130);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_128,&local_130);
    pCVar6 = (CJumpConditionalStatement *)operator_new(0x30);
    TVar2 = CJumpConditionalStatement::Operation((CJumpConditionalStatement *)left_local);
    this_02 = (CMemExpression *)operator_new(0x10);
    local_161 = 1;
    pCVar5 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar5,(CTemp *)local_d0);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_160,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_158,&local_160);
    CMemExpression::CMemExpression(this_02,&local_158);
    local_161 = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_150,(pointer)this_02);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_148,&local_150);
    pCVar7 = CEseqExpression::getExpression(local_30);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_178);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_170,&local_178);
    CJumpConditionalStatement::TrueLabel((CJumpConditionalStatement *)left_local);
    CLabelStatement::CastCopy((CLabelStatement *)local_188);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_188 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_188);
    CJumpConditionalStatement::FalseLabel((CJumpConditionalStatement *)left_local);
    CLabelStatement::CastCopy((CLabelStatement *)local_198);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_198 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)local_198);
    CJumpConditionalStatement::CJumpConditionalStatement
              (pCVar6,TVar2,&local_148,&local_170,
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_188 + 8),
               (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                *)(local_198 + 8));
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_140,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_138,&local_140);
    CSeqStatement::CSeqStatement(this_01,&local_128,&local_138);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_120,(pointer)this_01);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_118,&local_120);
    CSeqStatement::CSeqStatement(pCVar4,&local_e0,&local_118);
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_d8,(pointer)pCVar4);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               this,&local_d8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_d8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_118);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_120);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_138);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_140);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_198 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_198);
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)(local_188 + 8));
    std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
    ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                 *)local_188);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_170);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_178);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_148);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_150);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_158);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_160);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_128);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_130);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_e0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_e8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_100);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_108);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_f0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_f8);
    CTemp::~CTemp((CTemp *)local_d0);
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processRightEseqInCJump(
        const IRT::CJumpConditionalStatement *cjump,
        const IRT::CExpression *left, const IRT::CEseqExpression *rightEseq) {

    if (isExpCommuteWithStm(left, rightEseq->getStatement())) {
        return SMOVE_UNIQ(new CSeqStatement(
                std::move(rightEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CJumpConditionalStatement(
                        cjump->Operation(),
                        std::move(left->Copy()),
                        std::move(rightEseq->getExpression()->Copy()),
                        std::move(cjump->TrueLabel()->CastCopy()),
                        std::move(cjump->FalseLabel()->CastCopy())
                ))
        ));
    } else {
        CTemp temp;
        return SMOVE_UNIQ(new CSeqStatement(
                SMOVE_UNIQ(new CMoveStatement(
                        EMOVE_UNIQ(new CTempExpression(temp)),
                        std::move(left->Copy())
                )),
                SMOVE_UNIQ(new CSeqStatement(
                        std::move(rightEseq->getStatement()->Copy()),
                        SMOVE_UNIQ(new CJumpConditionalStatement(
                                cjump->Operation(),
                                EMOVE_UNIQ(new CMemExpression(EMOVE_UNIQ(new CTempExpression(temp)))),
                                std::move(rightEseq->getExpression()->Copy()),
                                std::move(cjump->TrueLabel()->CastCopy()),
                                std::move(cjump->FalseLabel()->CastCopy())
                        ))
                ))
        ));
    }
}